

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlattribute.cpp
# Opt level: O3

bool __thiscall libcellml::XmlAttribute::isType(XmlAttribute *this,char *name,char *ns)

{
  int iVar1;
  bool bVar2;
  string local_40;
  
  namespaceUri_abi_cxx11_(&local_40,this);
  iVar1 = xmlStrcmp(local_40._M_dataplus._M_p,ns);
  if (iVar1 == 0) {
    iVar1 = xmlStrcmp(this->mPimpl->mXmlAttributePtr->name,name);
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool XmlAttribute::isType(const char *name, const char *ns) const
{
    return (xmlStrcmp(reinterpret_cast<const xmlChar *>(namespaceUri().c_str()), reinterpret_cast<const xmlChar *>(ns)) == 0)
           && (xmlStrcmp(mPimpl->mXmlAttributePtr->name, reinterpret_cast<const xmlChar *>(name)) == 0);
}